

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer_scriptpubkeyman.cpp
# Opt level: O3

ExternalSigner * wallet::ExternalSignerScriptPubKeyMan::GetExternalSigner(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string chain;
  int iVar2;
  CChainParams *pCVar3;
  runtime_error *prVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ExternalSigner *in_RDI;
  long in_FS_OFFSET;
  vector<ExternalSigner,_std::allocator<ExternalSigner>_> signers;
  string command;
  ExternalSigner *pEVar7;
  ExternalSigner *pEVar8;
  pointer pEVar9;
  _Alloc_hider in_stack_ffffffffffffff50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  string local_90;
  string local_70;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"-signer","");
  paVar6 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  ArgsManager::GetArg(&local_50,&gArgs,&local_70,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar6) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_50,"");
  if (iVar2 == 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_90._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"GetExternalSigner","");
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_90,": restart bitcoind with -signer=<cmd>");
    local_70._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    paVar6 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == paVar6) {
      local_70.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      local_70._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_70.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    local_70._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    std::runtime_error::runtime_error(prVar4,(string *)&local_70);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    pEVar7 = (ExternalSigner *)0x0;
    pEVar8 = (ExternalSigner *)0x0;
    pEVar9 = (pointer)0x0;
    pCVar3 = Params();
    ChainTypeToString_abi_cxx11_((string *)&stack0xffffffffffffff50,pCVar3->m_chain_type);
    chain._M_string_length = (size_type)pEVar8;
    chain._M_dataplus._M_p = (pointer)pEVar7;
    chain.field_2._M_allocated_capacity = (size_type)pEVar9;
    chain.field_2._8_8_ = in_stack_ffffffffffffff50._M_p;
    ExternalSigner::Enumerate
              (&local_50,
               (vector<ExternalSigner,_std::allocator<ExternalSigner>_> *)&stack0xffffffffffffff38,
               chain);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffff50._M_p != &local_a0) {
      operator_delete(in_stack_ffffffffffffff50._M_p,local_a0._M_allocated_capacity + 1);
    }
    if (pEVar7 == pEVar8) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_90._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"GetExternalSigner","");
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_90,": No external signers found");
      local_70._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
      paVar6 = &pbVar5->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == paVar6) {
        local_70.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        local_70._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_70.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_70._M_string_length = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      std::runtime_error::runtime_error(prVar4,(string *)&local_70);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else if ((ulong)((long)pEVar8 - (long)pEVar7) < 0x81) {
      ExternalSigner::ExternalSigner(in_RDI,pEVar7);
      std::vector<ExternalSigner,_std::allocator<ExternalSigner>_>::~vector
                ((vector<ExternalSigner,_std::allocator<ExternalSigner>_> *)&stack0xffffffffffffff38
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return in_RDI;
      }
    }
    else {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_90._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"GetExternalSigner","");
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_90,
                      ": More than one external signer found. Please connect only one at a time.");
      local_70._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
      paVar6 = &pbVar5->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == paVar6) {
        local_70.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        local_70._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_70.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_70._M_string_length = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      std::runtime_error::runtime_error(prVar4,(string *)&local_70);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

ExternalSigner ExternalSignerScriptPubKeyMan::GetExternalSigner() {
    const std::string command = gArgs.GetArg("-signer", "");
    if (command == "") throw std::runtime_error(std::string(__func__) + ": restart bitcoind with -signer=<cmd>");
    std::vector<ExternalSigner> signers;
    ExternalSigner::Enumerate(command, signers, Params().GetChainTypeString());
    if (signers.empty()) throw std::runtime_error(std::string(__func__) + ": No external signers found");
    // TODO: add fingerprint argument instead of failing in case of multiple signers.
    if (signers.size() > 1) throw std::runtime_error(std::string(__func__) + ": More than one external signer found. Please connect only one at a time.");
    return signers[0];
}